

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS2fstreamMPI.cpp
# Opt level: O1

int __thiscall adios2::fstream::open(fstream *this,char *__file,int __oflag,...)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Stream *pSVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  undefined1 local_61;
  ompi_communicator_t local_60 [8];
  Stream *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  Mode local_34;
  
  local_40 = in_R8;
  adios2::fstream::CheckOpen((string *)this);
  local_34 = adios2::fstream::ToMode((openmode)this);
  adios2::helper::CommDupMPI(local_60);
  local_58 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<adios2::core::Stream,std::allocator<adios2::core::Stream>,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm,std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[4]>
            (a_Stack_50,&local_58,(allocator<adios2::core::Stream> *)&local_61,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__file,&local_34,
             (Comm *)local_60,local_40,in_R9,(char (*) [4])"C++");
  _Var2._M_pi = a_Stack_50[0]._M_pi;
  pSVar1 = local_58;
  local_58 = (Stream *)0x0;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_Stream).super___shared_ptr<adios2::core::Stream,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_Stream).super___shared_ptr<adios2::core::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pSVar1;
  (this->m_Stream).super___shared_ptr<adios2::core::Stream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
  }
  iVar3 = adios2::helper::Comm::~Comm((Comm *)local_60);
  return iVar3;
}

Assistant:

void fstream::open(const std::string &name, const openmode mode, MPI_Comm comm,
                   const std::string configFile, const std::string ioInConfigFile)
{
    CheckOpen(name);
    m_Stream = std::make_shared<core::Stream>(name, ToMode(mode), helper::CommDupMPI(comm),
                                              configFile, ioInConfigFile, "C++");
}